

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

shared_ptr<helics::ValueFederate> getValueFedSharedPtr(HelicsFederate fed,HelicsError *err)

{
  FedObject *pFVar1;
  HelicsError *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  shared_ptr<helics::ValueFederate> sVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  pFVar1 = helics::getFedObject(err,in_RDX);
  _Var2._M_pi = extraout_RDX;
  if (pFVar1 != (FedObject *)0x0) {
    if (pFVar1->type < INVALID) {
      _Var2._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1a;
      if ((0x1aU >> (pFVar1->type & 0x1f) & 1) != 0) {
        sVar3 = std::dynamic_pointer_cast<helics::ValueFederate,helics::Federate>
                          ((shared_ptr<helics::Federate> *)fed);
        _Var2 = sVar3.super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
        if (*fed != 0) goto LAB_0017c7fe;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)fed + 8));
        _Var2._M_pi = extraout_RDX_00;
      }
    }
    if (in_RDX != (HelicsError *)0x0) {
      in_RDX->error_code = -3;
      in_RDX->message = "Federate must be a value federate";
    }
  }
  *(undefined8 *)fed = 0;
  *(undefined8 *)((long)fed + 8) = 0;
LAB_0017c7fe:
  sVar3.super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)fed;
  return (shared_ptr<helics::ValueFederate>)
         sVar3.super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<helics::ValueFederate> getValueFedSharedPtr(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = helics::getFedObject(fed, err);
    if (fedObj == nullptr) {
        return nullptr;
    }
    if ((fedObj->type == helics::FederateType::VALUE) || (fedObj->type == helics::FederateType::COMBINATION) ||
        (fedObj->type == helics::FederateType::CALLBACK)) {
        auto rval = std::dynamic_pointer_cast<helics::ValueFederate>(fedObj->fedptr);
        if (rval) {
            return rval;
        }
    }
    assignError(err, HELICS_ERROR_INVALID_OBJECT, notValueFedString);
    return nullptr;
}